

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_sin_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  unkuint10 Var5;
  unkuint10 Var6;
  unkuint10 Var7;
  unkuint10 Var8;
  byte bVar9;
  flag zSign;
  int32_t iVar10;
  float32 a_00;
  uint64_t uVar11;
  uint16_t uVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 a_31;
  floatx80 a_32;
  floatx80 a_33;
  floatx80 a_34;
  floatx80 a_35;
  floatx80 a_36;
  floatx80 a_37;
  floatx80 a_38;
  floatx80 a_39;
  floatx80 a_40;
  floatx80 a_41;
  floatx80 a_42;
  floatx80 a_43;
  floatx80 a_44;
  floatx80 a_45;
  floatx80 a_46;
  floatx80 a_47;
  floatx80 a_48;
  floatx80 a_49;
  floatx80 a_50;
  floatx80 a_51;
  floatx80 a_52;
  floatx80 a_53;
  floatx80 a_54;
  floatx80 a_55;
  floatx80 a_56;
  floatx80 a_57;
  floatx80 a_58;
  floatx80 a_59;
  floatx80 a_60;
  floatx80 a_61;
  floatx80 a_62;
  floatx80 a_63;
  floatx80 a_64;
  floatx80 a_65;
  floatx80 a_66;
  floatx80 a_67;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  floatx80 b_34;
  floatx80 b_35;
  floatx80 b_36;
  floatx80 b_37;
  floatx80 b_38;
  floatx80 b_39;
  floatx80 b_40;
  floatx80 b_41;
  floatx80 b_42;
  floatx80 b_43;
  floatx80 b_44;
  floatx80 b_45;
  floatx80 b_46;
  floatx80 b_47;
  floatx80 b_48;
  floatx80 b_49;
  floatx80 b_50;
  floatx80 b_51;
  floatx80 b_52;
  floatx80 b_53;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  bool local_111;
  float32 fStack_10c;
  flag endflag;
  float32 twoto63;
  float32 posneg1;
  floatx80 twopi2;
  floatx80 twopi1;
  floatx80 invtwopi;
  floatx80 x;
  floatx80 fp5;
  floatx80 fp4;
  floatx80 fp3;
  floatx80 fp2;
  floatx80 fp1;
  floatx80 fp0;
  uint local_60;
  int32_t j;
  int32_t n;
  int32_t l;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t xSig;
  uint64_t aSig;
  int32_t xExp;
  int32_t aExp;
  flag xSign;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  fp1._8_8_ = a.low;
  fp0.low._0_2_ = a.high;
  Var5 = a._0_10_;
  fVar14._10_6_ = 0;
  fVar14.low = (long)Var5;
  fVar14.high = (short)(Var5 >> 0x40);
  uVar11 = extractFloatx80Frac(fVar14);
  fVar15._10_6_ = 0;
  fVar15.low = (long)Var5;
  fVar15.high = (short)(Var5 >> 0x40);
  iVar10 = extractFloatx80Exp(fVar15);
  fVar16._10_6_ = 0;
  fVar16.low = (long)Var5;
  fVar16.high = (short)(Var5 >> 0x40);
  bVar9 = extractFloatx80Sign(fVar16);
  if (iVar10 == 0x7fff) {
    if ((uVar11 & 0x7fffffffffffffff) == 0) {
      float_raise_m68k('\x01',status);
      fVar13 = floatx80_default_nan_m68k(status);
      uVar12 = fVar13.high;
    }
    else {
      a_01._10_6_ = 0;
      a_01.low = (long)Var5;
      a_01.high = (short)(Var5 >> 0x40);
      fVar13 = propagateFloatx80NaNOneArg(a_01,status);
      uVar12 = fVar13.high;
    }
  }
  else if ((iVar10 == 0) && (uVar11 == 0)) {
    fVar13 = packFloatx80(bVar9,0,0);
    uVar12 = fVar13.high;
  }
  else {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    iVar10 = floatx80_make_compact(iVar10,uVar11);
    if ((iVar10 < 0x3fd78000) || (0x4004bc7e < iVar10)) {
      if (iVar10 < 0x3fff8001) {
        float32_to_floatx80_m68k(0x3f800000,status);
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        a_22._10_6_ = 0;
        a_22.low = (long)Var5;
        a_22.high = (short)(Var5 >> 0x40);
        fVar14 = floatx80_move_m68k(a_22,status);
        uVar12 = fVar14.high;
        float_raise_m68k(' ',status);
        fVar13._8_8_ = extraout_RDX;
        fVar13.low = fVar14.low;
        goto LAB_008b8845;
      }
      fVar14 = packFloatx80('\0',0,0);
      fp2._8_8_ = fVar14.low;
      fp1.low._0_2_ = fVar14.high;
      if (iVar10 == 0x7ffeffff) {
        fVar14 = packFloatx80(bVar9 ^ 1,0x7ffe,0xc90fdaa200000000);
        fVar15 = packFloatx80(bVar9 ^ 1,0x7fdc,0x85a308d300000000);
        a_02._10_6_ = 0;
        a_02.low = (long)Var5;
        a_02.high = (short)(Var5 >> 0x40);
        b._10_6_ = 0;
        b.low = (long)fVar14._0_10_;
        b.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_add_m68k(a_02,b,status);
        Var6 = fVar14._0_10_;
        Var5 = fVar15._0_10_;
        a_03._10_6_ = 0;
        a_03.low = (long)Var6;
        a_03.high = (short)(Var6 >> 0x40);
        b_00._10_6_ = 0;
        b_00.low = (long)Var5;
        b_00.high = (short)(Var5 >> 0x40);
        fVar14 = floatx80_add_m68k(a_03,b_00,status);
        fp1._8_8_ = fVar14.low;
        fp0.low._0_2_ = fVar14.high;
        a_04._10_6_ = 0;
        a_04.low = (long)Var6;
        a_04.high = (short)(Var6 >> 0x40);
        b_01._10_6_ = 0;
        b_01.low = (long)fVar14._0_10_;
        b_01.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_sub_m68k(a_04,b_01,status);
        a_05._10_6_ = 0;
        a_05.low = (long)fVar14._0_10_;
        a_05.high = (short)(fVar14._0_10_ >> 0x40);
        b_02._10_6_ = 0;
        b_02.low = (long)Var5;
        b_02.high = (short)(Var5 >> 0x40);
        fVar14 = floatx80_add_m68k(a_05,b_02,status);
        fp2._8_8_ = fVar14.low;
        fp1.low._0_2_ = fVar14.high;
      }
      while( true ) {
        a_06.high = (uint16_t)fp0.low;
        a_06.low = fp1._8_8_;
        a_06._10_6_ = 0;
        zSign = extractFloatx80Sign(a_06);
        a_07.high = (uint16_t)fp0.low;
        a_07.low = fp1._8_8_;
        a_07._10_6_ = 0;
        iVar10 = extractFloatx80Exp(a_07);
        local_111 = 0x1c < iVar10 + -0x3fff;
        if (local_111) {
          j = iVar10 + -0x401a;
        }
        else {
          j = 0;
        }
        local_111 = !local_111;
        fVar14 = packFloatx80('\0',0x3ffe - j,0xa2f9836e4e44152a);
        fVar15 = packFloatx80('\0',j + 0x3fff,0xc90fdaa200000000);
        fVar16 = packFloatx80('\0',j + 0x3fdd,0x85a308d300000000);
        a_00 = packFloat32(zSign,0xbe,0);
        a_08.high = (uint16_t)fp0.low;
        a_08.low = fp1._8_8_;
        a_08._10_6_ = 0;
        b_03._10_6_ = 0;
        b_03.low = (long)fVar14._0_10_;
        b_03.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_mul_m68k(a_08,b_03,status);
        fVar13 = float32_to_floatx80_m68k(a_00,status);
        a_09._10_6_ = 0;
        a_09.low = (long)fVar14._0_10_;
        a_09.high = (short)(fVar14._0_10_ >> 0x40);
        b_04._10_6_ = 0;
        b_04.low = (long)fVar13._0_10_;
        b_04.high = (short)(fVar13._0_10_ >> 0x40);
        fVar14 = floatx80_add_m68k(a_09,b_04,status);
        fVar13 = float32_to_floatx80_m68k(a_00,status);
        a_10._10_6_ = 0;
        a_10.low = (long)fVar14._0_10_;
        a_10.high = (short)(fVar14._0_10_ >> 0x40);
        b_05._10_6_ = 0;
        b_05.low = (long)fVar13._0_10_;
        b_05.high = (short)(fVar13._0_10_ >> 0x40);
        fVar14 = floatx80_sub_m68k(a_10,b_05,status);
        Var8 = fVar14._0_10_;
        a_11._10_6_ = 0;
        a_11.low = (long)fVar15._0_10_;
        a_11.high = (short)(fVar15._0_10_ >> 0x40);
        b_06._10_6_ = 0;
        b_06.low = (long)Var8;
        b_06.high = (short)(Var8 >> 0x40);
        fVar14 = floatx80_mul_m68k(a_11,b_06,status);
        a_12._10_6_ = 0;
        a_12.low = (long)fVar16._0_10_;
        a_12.high = (short)(fVar16._0_10_ >> 0x40);
        b_07._10_6_ = 0;
        b_07.low = (long)Var8;
        b_07.high = (short)(Var8 >> 0x40);
        fVar15 = floatx80_mul_m68k(a_12,b_07,status);
        Var6 = fVar14._0_10_;
        Var5 = fVar15._0_10_;
        a_13._10_6_ = 0;
        a_13.low = (long)Var6;
        a_13.high = (short)(Var6 >> 0x40);
        b_08._10_6_ = 0;
        b_08.low = (long)Var5;
        b_08.high = (short)(Var5 >> 0x40);
        fVar14 = floatx80_add_m68k(a_13,b_08,status);
        Var7 = fVar14._0_10_;
        a_14._10_6_ = 0;
        a_14.low = (long)Var6;
        a_14.high = (short)(Var6 >> 0x40);
        b_09._10_6_ = 0;
        b_09.low = (long)Var7;
        b_09.high = (short)(Var7 >> 0x40);
        fVar14 = floatx80_sub_m68k(a_14,b_09,status);
        a_15.high = (uint16_t)fp0.low;
        a_15.low = fp1._8_8_;
        a_15._10_6_ = 0;
        b_10._10_6_ = 0;
        b_10.low = (long)Var7;
        b_10.high = (short)(Var7 >> 0x40);
        fVar15 = floatx80_sub_m68k(a_15,b_10,status);
        a_16._10_6_ = 0;
        a_16.low = (long)fVar14._0_10_;
        a_16.high = (short)(fVar14._0_10_ >> 0x40);
        b_11._10_6_ = 0;
        b_11.low = (long)Var5;
        b_11.high = (short)(Var5 >> 0x40);
        fVar14 = floatx80_add_m68k(a_16,b_11,status);
        a_17.high = (uint16_t)fp1.low;
        a_17.low = fp2._8_8_;
        a_17._10_6_ = 0;
        b_12._10_6_ = 0;
        b_12.low = (long)fVar14._0_10_;
        b_12.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_sub_m68k(a_17,b_12,status);
        Var6 = fVar15._0_10_;
        Var5 = fVar14._0_10_;
        a_18._10_6_ = 0;
        a_18.low = (long)Var6;
        a_18.high = (short)(Var6 >> 0x40);
        b_13._10_6_ = 0;
        b_13.low = (long)Var5;
        b_13.high = (short)(Var5 >> 0x40);
        fVar14 = floatx80_add_m68k(a_18,b_13,status);
        fp1._8_8_ = fVar14.low;
        fp0.low._0_2_ = fVar14.high;
        if (local_111) break;
        a_20._10_6_ = 0;
        a_20.low = (long)Var6;
        a_20.high = (short)(Var6 >> 0x40);
        b_14._10_6_ = 0;
        b_14.low = (long)fVar14._0_10_;
        b_14.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_sub_m68k(a_20,b_14,status);
        a_21._10_6_ = 0;
        a_21.low = (long)Var5;
        a_21.high = (short)(Var5 >> 0x40);
        b_15._10_6_ = 0;
        b_15.low = (long)fVar14._0_10_;
        b_15.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_add_m68k(a_21,b_15,status);
        fp2._8_8_ = fVar14.low;
        fp1.low._0_2_ = fVar14.high;
      }
      a_19._10_6_ = 0;
      a_19.low = (long)Var8;
      a_19.high = (short)(Var8 >> 0x40);
      local_60 = floatx80_to_int32_m68k(a_19,status);
    }
    else {
      fVar14 = float64_to_floatx80_m68k(0x3fe45f306dc9c883,status);
      a_23._10_6_ = 0;
      a_23.low = (long)Var5;
      a_23.high = (short)(Var5 >> 0x40);
      b_16._10_6_ = 0;
      b_16.low = (long)fVar14._0_10_;
      b_16.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_23,b_16,status);
      a_24._10_6_ = 0;
      a_24.low = (long)fVar14._0_10_;
      a_24.high = (short)(fVar14._0_10_ >> 0x40);
      local_60 = floatx80_to_int32_m68k(a_24,status);
      uVar3 = pi_tbl[(int)(local_60 + 0x20)].low;
      uVar4 = pi_tbl[(int)(local_60 + 0x20)].high;
      b_17.high = uVar4;
      b_17.low = uVar3;
      a_25._10_6_ = 0;
      a_25.low = (long)Var5;
      a_25.high = (short)(Var5 >> 0x40);
      b_17._10_6_ = 0;
      fVar14 = floatx80_sub_m68k(a_25,b_17,status);
      fVar15 = float32_to_floatx80_m68k(pi_tbl2[(int)(local_60 + 0x20)],status);
      a_26._10_6_ = 0;
      a_26.low = (long)fVar14._0_10_;
      a_26.high = (short)(fVar14._0_10_ >> 0x40);
      b_18._10_6_ = 0;
      b_18.low = (long)fVar15._0_10_;
      b_18.high = (short)(fVar15._0_10_ >> 0x40);
      fVar14 = floatx80_sub_m68k(a_26,b_18,status);
      fp1._8_8_ = fVar14.low;
      fp0.low._0_2_ = fVar14.high;
    }
    if ((local_60 & 1) == 0) {
      a_48.high = (uint16_t)fp0.low;
      a_48.low = fp1._8_8_;
      a_48._10_6_ = 0;
      bVar9 = extractFloatx80Sign(a_48);
      a_49.high = (uint16_t)fp0.low;
      a_49.low = fp1._8_8_;
      a_49._10_6_ = 0;
      iVar10 = extractFloatx80Exp(a_49);
      a_50.high = (uint16_t)fp0.low;
      a_50.low = fp1._8_8_;
      a_50._10_6_ = 0;
      uVar11 = extractFloatx80Frac(a_50);
      a_51.high = (uint16_t)fp0.low;
      a_51.low = fp1._8_8_;
      b_37.high = (uint16_t)fp0.low;
      b_37.low = fp1._8_8_;
      a_51._10_6_ = 0;
      b_37._10_6_ = 0;
      fVar14 = floatx80_mul_m68k(a_51,b_37,status);
      Var6 = fVar14._0_10_;
      a_52._10_6_ = 0;
      a_52.low = (long)Var6;
      a_52.high = (short)(Var6 >> 0x40);
      b_38._10_6_ = 0;
      b_38.low = (long)Var6;
      b_38.high = (short)(Var6 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_52,b_38,status);
      fVar15 = float64_to_floatx80_m68k(0xbd6aaa77ccc994f5,status);
      fVar16 = float64_to_floatx80_m68k(0x3de612097aae8da1,status);
      Var5 = fVar14._0_10_;
      a_53._10_6_ = 0;
      a_53.low = (long)fVar15._0_10_;
      a_53.high = (short)(fVar15._0_10_ >> 0x40);
      b_39._10_6_ = 0;
      b_39.low = (long)Var5;
      b_39.high = (short)(Var5 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_53,b_39,status);
      a_54._10_6_ = 0;
      a_54.low = (long)fVar16._0_10_;
      a_54.high = (short)(fVar16._0_10_ >> 0x40);
      b_40._10_6_ = 0;
      b_40.low = (long)Var5;
      b_40.high = (short)(Var5 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_54,b_40,status);
      fVar16 = float64_to_floatx80_m68k(0xbe5ae6452a118ae4,status);
      a_55._10_6_ = 0;
      a_55.low = (long)fVar14._0_10_;
      a_55.high = (short)(fVar14._0_10_ >> 0x40);
      b_41._10_6_ = 0;
      b_41.low = (long)fVar16._0_10_;
      b_41.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_55,b_41,status);
      fVar16 = float64_to_floatx80_m68k(0x3ec71de3a5341531,status);
      a_56._10_6_ = 0;
      a_56.low = (long)fVar15._0_10_;
      a_56.high = (short)(fVar15._0_10_ >> 0x40);
      b_42._10_6_ = 0;
      b_42.low = (long)fVar16._0_10_;
      b_42.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_56,b_42,status);
      a_57._10_6_ = 0;
      a_57.low = (long)fVar14._0_10_;
      a_57.high = (short)(fVar14._0_10_ >> 0x40);
      b_43._10_6_ = 0;
      b_43.low = (long)Var5;
      b_43.high = (short)(Var5 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_57,b_43,status);
      a_58._10_6_ = 0;
      a_58.low = (long)fVar15._0_10_;
      a_58.high = (short)(fVar15._0_10_ >> 0x40);
      b_44._10_6_ = 0;
      b_44.low = (long)Var5;
      b_44.high = (short)(Var5 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_58,b_44,status);
      fVar16 = float64_to_floatx80_m68k(0xbf2a01a01a018b59,status);
      a_59._10_6_ = 0;
      a_59.low = (long)fVar14._0_10_;
      a_59.high = (short)(fVar14._0_10_ >> 0x40);
      b_45._10_6_ = 0;
      b_45.low = (long)fVar16._0_10_;
      b_45.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_59,b_45,status);
      fVar16 = packFloatx80('\0',0x3ff8,0x88888888888859af);
      a_60._10_6_ = 0;
      a_60.low = (long)fVar15._0_10_;
      a_60.high = (short)(fVar15._0_10_ >> 0x40);
      b_46._10_6_ = 0;
      b_46.low = (long)fVar16._0_10_;
      b_46.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_60,b_46,status);
      a_61._10_6_ = 0;
      a_61.low = (long)Var5;
      a_61.high = (short)(Var5 >> 0x40);
      b_47._10_6_ = 0;
      b_47.low = (long)fVar14._0_10_;
      b_47.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_61,b_47,status);
      a_62._10_6_ = 0;
      a_62.low = (long)fVar15._0_10_;
      a_62.high = (short)(fVar15._0_10_ >> 0x40);
      b_48._10_6_ = 0;
      b_48.low = (long)Var6;
      b_48.high = (short)(Var6 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_62,b_48,status);
      fVar16 = packFloatx80('\x01',0x3ffc,0xaaaaaaaaaaaaaa99);
      a_63._10_6_ = 0;
      a_63.low = (long)fVar14._0_10_;
      a_63.high = (short)(fVar14._0_10_ >> 0x40);
      b_49._10_6_ = 0;
      b_49.low = (long)fVar16._0_10_;
      b_49.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_63,b_49,status);
      a_64._10_6_ = 0;
      a_64.low = (long)fVar14._0_10_;
      a_64.high = (short)(fVar14._0_10_ >> 0x40);
      b_50._10_6_ = 0;
      b_50.low = (long)fVar15._0_10_;
      b_50.high = (short)(fVar15._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_64,b_50,status);
      fVar15 = packFloatx80(bVar9 ^ (byte)((int)local_60 >> 1) & 1,iVar10,uVar11);
      Var5 = fVar15._0_10_;
      a_65._10_6_ = 0;
      a_65.low = (long)Var6;
      a_65.high = (short)(Var6 >> 0x40);
      b_51._10_6_ = 0;
      b_51.low = (long)Var5;
      b_51.high = (short)(Var5 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_65,b_51,status);
      a_66._10_6_ = 0;
      a_66.low = (long)fVar15._0_10_;
      a_66.high = (short)(fVar15._0_10_ >> 0x40);
      b_52._10_6_ = 0;
      b_52.low = (long)fVar14._0_10_;
      b_52.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_66,b_52,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      a_67._10_6_ = 0;
      a_67.low = (long)fVar14._0_10_;
      a_67.high = (short)(fVar14._0_10_ >> 0x40);
      b_53._10_6_ = 0;
      b_53.low = (long)Var5;
      b_53.high = (short)(Var5 >> 0x40);
      fVar14 = floatx80_add_m68k(a_67,b_53,status);
      uVar12 = fVar14.high;
      float_raise_m68k(' ',status);
      fVar13._8_8_ = extraout_RDX_01;
      fVar13.low = fVar14.low;
    }
    else {
      a_27.high = (uint16_t)fp0.low;
      a_27.low = fp1._8_8_;
      b_19.high = (uint16_t)fp0.low;
      b_19.low = fp1._8_8_;
      a_27._10_6_ = 0;
      b_19._10_6_ = 0;
      fVar14 = floatx80_mul_m68k(a_27,b_19,status);
      Var5 = fVar14._0_10_;
      a_28._10_6_ = 0;
      a_28.low = (long)Var5;
      a_28.high = (short)(Var5 >> 0x40);
      b_20._10_6_ = 0;
      b_20.low = (long)Var5;
      b_20.high = (short)(Var5 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_28,b_20,status);
      fVar15 = float64_to_floatx80_m68k(0x3d2ac4d0d6011ee3,status);
      fVar16 = float64_to_floatx80_m68k(0xbda9396f9f45ac19,status);
      a_29._10_6_ = 0;
      a_29.low = (long)Var5;
      a_29.high = (short)(Var5 >> 0x40);
      xExp._2_1_ = extractFloatx80Sign(a_29);
      a_30._10_6_ = 0;
      a_30.low = (long)Var5;
      a_30.high = (short)(Var5 >> 0x40);
      iVar10 = extractFloatx80Exp(a_30);
      a_31._10_6_ = 0;
      a_31.low = (long)Var5;
      a_31.high = (short)(Var5 >> 0x40);
      uVar11 = extractFloatx80Frac(a_31);
      if (((int)local_60 >> 1 & 1U) == 0) {
        fStack_10c = 0x3f800000;
      }
      else {
        xExp._2_1_ = xExp._2_1_ ^ 1;
        fStack_10c = 0xbf800000;
      }
      Var6 = fVar14._0_10_;
      a_32._10_6_ = 0;
      a_32.low = (long)fVar15._0_10_;
      a_32.high = (short)(fVar15._0_10_ >> 0x40);
      b_21._10_6_ = 0;
      b_21.low = (long)Var6;
      b_21.high = (short)(Var6 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_32,b_21,status);
      a_33._10_6_ = 0;
      a_33.low = (long)fVar16._0_10_;
      a_33.high = (short)(fVar16._0_10_ >> 0x40);
      b_22._10_6_ = 0;
      b_22.low = (long)Var6;
      b_22.high = (short)(Var6 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_33,b_22,status);
      fVar16 = float64_to_floatx80_m68k(0x3e21eed90612c972,status);
      a_34._10_6_ = 0;
      a_34.low = (long)fVar14._0_10_;
      a_34.high = (short)(fVar14._0_10_ >> 0x40);
      b_23._10_6_ = 0;
      b_23.low = (long)fVar16._0_10_;
      b_23.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_34,b_23,status);
      fVar16 = float64_to_floatx80_m68k(0xbe927e4fb79d9fcf,status);
      a_35._10_6_ = 0;
      a_35.low = (long)fVar15._0_10_;
      a_35.high = (short)(fVar15._0_10_ >> 0x40);
      b_24._10_6_ = 0;
      b_24.low = (long)fVar16._0_10_;
      b_24.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_35,b_24,status);
      a_36._10_6_ = 0;
      a_36.low = (long)fVar14._0_10_;
      a_36.high = (short)(fVar14._0_10_ >> 0x40);
      b_25._10_6_ = 0;
      b_25.low = (long)Var6;
      b_25.high = (short)(Var6 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_36,b_25,status);
      a_37._10_6_ = 0;
      a_37.low = (long)fVar15._0_10_;
      a_37.high = (short)(fVar15._0_10_ >> 0x40);
      b_26._10_6_ = 0;
      b_26.low = (long)Var6;
      b_26.high = (short)(Var6 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_37,b_26,status);
      fVar16 = float64_to_floatx80_m68k(0x3efa01a01a01d423,status);
      a_38._10_6_ = 0;
      a_38.low = (long)fVar14._0_10_;
      a_38.high = (short)(fVar14._0_10_ >> 0x40);
      b_27._10_6_ = 0;
      b_27.low = (long)fVar16._0_10_;
      b_27.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_38,b_27,status);
      fVar16 = packFloatx80('\x01',0x3ff5,0xb60b60b60b61d438);
      a_39._10_6_ = 0;
      a_39.low = (long)fVar15._0_10_;
      a_39.high = (short)(fVar15._0_10_ >> 0x40);
      b_28._10_6_ = 0;
      b_28.low = (long)fVar16._0_10_;
      b_28.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_39,b_28,status);
      a_40._10_6_ = 0;
      a_40.low = (long)fVar14._0_10_;
      a_40.high = (short)(fVar14._0_10_ >> 0x40);
      b_29._10_6_ = 0;
      b_29.low = (long)Var6;
      b_29.high = (short)(Var6 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_40,b_29,status);
      a_41._10_6_ = 0;
      a_41.low = (long)Var6;
      a_41.high = (short)(Var6 >> 0x40);
      b_30._10_6_ = 0;
      b_30.low = (long)fVar15._0_10_;
      b_30.high = (short)(fVar15._0_10_ >> 0x40);
      fVar15 = floatx80_mul_m68k(a_41,b_30,status);
      fVar16 = packFloatx80('\0',0x3ffa,0xaaaaaaaaaaaaab5e);
      a_42._10_6_ = 0;
      a_42.low = (long)fVar14._0_10_;
      a_42.high = (short)(fVar14._0_10_ >> 0x40);
      b_31._10_6_ = 0;
      b_31.low = (long)fVar16._0_10_;
      b_31.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_42,b_31,status);
      fVar16 = float32_to_floatx80_m68k(0xbf000000,status);
      a_43._10_6_ = 0;
      a_43.low = (long)fVar15._0_10_;
      a_43.high = (short)(fVar15._0_10_ >> 0x40);
      b_32._10_6_ = 0;
      b_32.low = (long)fVar16._0_10_;
      b_32.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_43,b_32,status);
      a_44._10_6_ = 0;
      a_44.low = (long)Var5;
      a_44.high = (short)(Var5 >> 0x40);
      b_33._10_6_ = 0;
      b_33.low = (long)fVar14._0_10_;
      b_33.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_44,b_33,status);
      a_45._10_6_ = 0;
      a_45.low = (long)fVar14._0_10_;
      a_45.high = (short)(fVar14._0_10_ >> 0x40);
      b_34._10_6_ = 0;
      b_34.low = (long)fVar15._0_10_;
      b_34.high = (short)(fVar15._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_45,b_34,status);
      fVar15 = packFloatx80(xExp._2_1_,iVar10,uVar11);
      a_46._10_6_ = 0;
      a_46.low = (long)fVar14._0_10_;
      a_46.high = (short)(fVar14._0_10_ >> 0x40);
      b_35._10_6_ = 0;
      b_35.low = (long)fVar15._0_10_;
      b_35.high = (short)(fVar15._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_46,b_35,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      fVar15 = float32_to_floatx80_m68k(fStack_10c,status);
      a_47._10_6_ = 0;
      a_47.low = (long)fVar14._0_10_;
      a_47.high = (short)(fVar14._0_10_ >> 0x40);
      b_36._10_6_ = 0;
      b_36.low = (long)fVar15._0_10_;
      b_36.high = (short)(fVar15._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_47,b_36,status);
      uVar12 = fVar14.high;
      float_raise_m68k(' ',status);
      fVar13._8_8_ = extraout_RDX_00;
      fVar13.low = fVar14.low;
    }
  }
LAB_008b8845:
  a_local._8_8_ = fVar13.low;
  fVar17._10_6_ = fVar13._10_6_;
  fVar17.high = uVar12;
  fVar17.low = a_local._8_8_;
  return fVar17;
}

Assistant:

floatx80 floatx80_sin(floatx80 a, float_status *status)
{
    flag aSign, xSign;
    int32_t aExp, xExp;
    uint64_t aSig, xSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, l, n, j;
    floatx80 fp0, fp1, fp2, fp3, fp4, fp5, x, invtwopi, twopi1, twopi2;
    float32 posneg1, twoto63;
    flag endflag;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    fp0 = a;

    if (compact < 0x3FD78000 || compact > 0x4004BC7E) {
        /* 2^(-40) > |X| > 15 PI */
        if (compact > 0x3FFF8000) { /* |X| >= 15 PI */
            /* REDUCEX */
            fp1 = packFloatx80(0, 0, 0);
            if (compact == 0x7FFEFFFF) {
                twopi1 = packFloatx80(aSign ^ 1, 0x7FFE,
                                      UINT64_C(0xC90FDAA200000000));
                twopi2 = packFloatx80(aSign ^ 1, 0x7FDC,
                                      UINT64_C(0x85A308D300000000));
                fp0 = floatx80_add(fp0, twopi1, status);
                fp1 = fp0;
                fp0 = floatx80_add(fp0, twopi2, status);
                fp1 = floatx80_sub(fp1, fp0, status);
                fp1 = floatx80_add(fp1, twopi2, status);
            }
        loop:
            xSign = extractFloatx80Sign(fp0);
            xExp = extractFloatx80Exp(fp0);
            xExp -= 0x3FFF;
            if (xExp <= 28) {
                l = 0;
                endflag = 1;
            } else {
                l = xExp - 27;
                endflag = 0;
            }
            invtwopi = packFloatx80(0, 0x3FFE - l,
                                    UINT64_C(0xA2F9836E4E44152A)); /* INVTWOPI */
            twopi1 = packFloatx80(0, 0x3FFF + l, UINT64_C(0xC90FDAA200000000));
            twopi2 = packFloatx80(0, 0x3FDD + l, UINT64_C(0x85A308D300000000));

            /* SIGN(INARG)*2^63 IN SGL */
            twoto63 = packFloat32(xSign, 0xBE, 0);

            fp2 = floatx80_mul(fp0, invtwopi, status);
            fp2 = floatx80_add(fp2, float32_to_floatx80(twoto63, status),
                               status); /* THE FRACT PART OF FP2 IS ROUNDED */
            fp2 = floatx80_sub(fp2, float32_to_floatx80(twoto63, status),
                               status); /* FP2 is N */
            fp4 = floatx80_mul(twopi1, fp2, status); /* W = N*P1 */
            fp5 = floatx80_mul(twopi2, fp2, status); /* w = N*P2 */
            fp3 = floatx80_add(fp4, fp5, status); /* FP3 is P */
            fp4 = floatx80_sub(fp4, fp3, status); /* W-P */
            fp0 = floatx80_sub(fp0, fp3, status); /* FP0 is A := R - P */
            fp4 = floatx80_add(fp4, fp5, status); /* FP4 is p = (W-P)+w */
            fp3 = fp0; /* FP3 is A */
            fp1 = floatx80_sub(fp1, fp4, status); /* FP1 is a := r - p */
            fp0 = floatx80_add(fp0, fp1, status); /* FP0 is R := A+a */

            if (endflag > 0) {
                n = floatx80_to_int32(fp2, status);
                goto sincont;
            }
            fp3 = floatx80_sub(fp3, fp0, status); /* A-R */
            fp1 = floatx80_add(fp1, fp3, status); /* FP1 is r := (A-R)+a */
            goto loop;
        } else {
            /* SINSM */
            fp0 = float32_to_floatx80(make_float32(0x3F800000),
                                      status); /* 1 */

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            /* SINTINY */
            a = floatx80_move(a, status);
            float_raise(float_flag_inexact, status);

            return a;
        }
    } else {
        fp1 = floatx80_mul(fp0, float64_to_floatx80(
                           make_float64(0x3FE45F306DC9C883), status),
                           status); /* X*2/PI */

        n = floatx80_to_int32(fp1, status);
        j = 32 + n;

        fp0 = floatx80_sub(fp0, pi_tbl[j], status); /* X-Y1 */
        fp0 = floatx80_sub(fp0, float32_to_floatx80(pi_tbl2[j], status),
                           status); /* FP0 IS R = (X-Y1)-Y2 */

    sincont:
        if (n & 1) {
            /* COSPOLY */
            fp0 = floatx80_mul(fp0, fp0, status); /* FP0 IS S */
            fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS T */
            fp2 = float64_to_floatx80(make_float64(0x3D2AC4D0D6011EE3),
                                      status); /* B8 */
            fp3 = float64_to_floatx80(make_float64(0xBDA9396F9F45AC19),
                                      status); /* B7 */

            xSign = extractFloatx80Sign(fp0); /* X IS S */
            xExp = extractFloatx80Exp(fp0);
            xSig = extractFloatx80Frac(fp0);

            if ((n >> 1) & 1) {
                xSign ^= 1;
                posneg1 = make_float32(0xBF800000); /* -1 */
            } else {
                xSign ^= 0;
                posneg1 = make_float32(0x3F800000); /* 1 */
            } /* X IS NOW R'= SGN*R */

            fp2 = floatx80_mul(fp2, fp1, status); /* TB8 */
            fp3 = floatx80_mul(fp3, fp1, status); /* TB7 */
            fp2 = floatx80_add(fp2, float64_to_floatx80(
                               make_float64(0x3E21EED90612C972), status),
                               status); /* B6+TB8 */
            fp3 = floatx80_add(fp3, float64_to_floatx80(
                               make_float64(0xBE927E4FB79D9FCF), status),
                               status); /* B5+TB7 */
            fp2 = floatx80_mul(fp2, fp1, status); /* T(B6+TB8) */
            fp3 = floatx80_mul(fp3, fp1, status); /* T(B5+TB7) */
            fp2 = floatx80_add(fp2, float64_to_floatx80(
                               make_float64(0x3EFA01A01A01D423), status),
                               status); /* B4+T(B6+TB8) */
            fp4 = packFloatx80(1, 0x3FF5, UINT64_C(0xB60B60B60B61D438));
            fp3 = floatx80_add(fp3, fp4, status); /* B3+T(B5+TB7) */
            fp2 = floatx80_mul(fp2, fp1, status); /* T(B4+T(B6+TB8)) */
            fp1 = floatx80_mul(fp1, fp3, status); /* T(B3+T(B5+TB7)) */
            fp4 = packFloatx80(0, 0x3FFA, UINT64_C(0xAAAAAAAAAAAAAB5E));
            fp2 = floatx80_add(fp2, fp4, status); /* B2+T(B4+T(B6+TB8)) */
            fp1 = floatx80_add(fp1, float32_to_floatx80(
                               make_float32(0xBF000000), status),
                               status); /* B1+T(B3+T(B5+TB7)) */
            fp0 = floatx80_mul(fp0, fp2, status); /* S(B2+T(B4+T(B6+TB8))) */
            fp0 = floatx80_add(fp0, fp1, status); /* [B1+T(B3+T(B5+TB7))]+
                                                   * [S(B2+T(B4+T(B6+TB8)))]
                                                   */

            x = packFloatx80(xSign, xExp, xSig);
            fp0 = floatx80_mul(fp0, x, status);

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_add(fp0, float32_to_floatx80(posneg1, status), status);

            float_raise(float_flag_inexact, status);

            return a;
        } else {
            /* SINPOLY */
            xSign = extractFloatx80Sign(fp0); /* X IS R */
            xExp = extractFloatx80Exp(fp0);
            xSig = extractFloatx80Frac(fp0);

            xSign ^= (n >> 1) & 1; /* X IS NOW R'= SGN*R */

            fp0 = floatx80_mul(fp0, fp0, status); /* FP0 IS S */
            fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS T */
            fp3 = float64_to_floatx80(make_float64(0xBD6AAA77CCC994F5),
                                      status); /* A7 */
            fp2 = float64_to_floatx80(make_float64(0x3DE612097AAE8DA1),
                                      status); /* A6 */
            fp3 = floatx80_mul(fp3, fp1, status); /* T*A7 */
            fp2 = floatx80_mul(fp2, fp1, status); /* T*A6 */
            fp3 = floatx80_add(fp3, float64_to_floatx80(
                               make_float64(0xBE5AE6452A118AE4), status),
                               status); /* A5+T*A7 */
            fp2 = floatx80_add(fp2, float64_to_floatx80(
                               make_float64(0x3EC71DE3A5341531), status),
                               status); /* A4+T*A6 */
            fp3 = floatx80_mul(fp3, fp1, status); /* T(A5+TA7) */
            fp2 = floatx80_mul(fp2, fp1, status); /* T(A4+TA6) */
            fp3 = floatx80_add(fp3, float64_to_floatx80(
                               make_float64(0xBF2A01A01A018B59), status),
                               status); /* A3+T(A5+TA7) */
            fp4 = packFloatx80(0, 0x3FF8, UINT64_C(0x88888888888859AF));
            fp2 = floatx80_add(fp2, fp4, status); /* A2+T(A4+TA6) */
            fp1 = floatx80_mul(fp1, fp3, status); /* T(A3+T(A5+TA7)) */
            fp2 = floatx80_mul(fp2, fp0, status); /* S(A2+T(A4+TA6)) */
            fp4 = packFloatx80(1, 0x3FFC, UINT64_C(0xAAAAAAAAAAAAAA99));
            fp1 = floatx80_add(fp1, fp4, status); /* A1+T(A3+T(A5+TA7)) */
            fp1 = floatx80_add(fp1, fp2,
                               status); /* [A1+T(A3+T(A5+TA7))]+
                                         * [S(A2+T(A4+TA6))]
                                         */

            x = packFloatx80(xSign, xExp, xSig);
            fp0 = floatx80_mul(fp0, x, status); /* R'*S */
            fp0 = floatx80_mul(fp0, fp1, status); /* SIN(R')-R' */

            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_add(fp0, x, status);

            float_raise(float_flag_inexact, status);

            return a;
        }
    }
}